

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O3

int SUNAdaptController_Write_MRIHTol(SUNAdaptController C,FILE *fptr)

{
  fwrite("Multirate H-Tol SUNAdaptController module:\n",0x2b,1,(FILE *)fptr);
  fprintf((FILE *)fptr,"  inner_max_relch  = %16g\n",*(undefined8 *)((long)C->content + 0x10));
  fprintf((FILE *)fptr,"  inner_min_tolfac = %16g\n",*(undefined8 *)((long)C->content + 0x18));
  fprintf((FILE *)fptr,"  inner_max_tolfac = %16g\n",*(undefined8 *)((long)C->content + 0x20));
  fwrite("\nSlow step controller:\n",0x17,1,(FILE *)fptr);
  SUNAdaptController_Write(*C->content,fptr);
  fwrite("\nFast tolerance controller:\n",0x1c,1,(FILE *)fptr);
  SUNAdaptController_Write(*(undefined8 *)((long)C->content + 8),fptr);
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_MRIHTol(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "Multirate H-Tol SUNAdaptController module:\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  fprintf(fptr, "  inner_max_relch  = %32Lg\n", MRIHTOL_INNER_MAX_RELCH(C));
  fprintf(fptr, "  inner_min_tolfac = %32Lg\n", MRIHTOL_INNER_MIN_TOLFAC(C));
  fprintf(fptr, "  inner_max_tolfac = %32Lg\n", MRIHTOL_INNER_MAX_TOLFAC(C));
#else
  fprintf(fptr, "  inner_max_relch  = %16g\n", MRIHTOL_INNER_MAX_RELCH(C));
  fprintf(fptr, "  inner_min_tolfac = %16g\n", MRIHTOL_INNER_MIN_TOLFAC(C));
  fprintf(fptr, "  inner_max_tolfac = %16g\n", MRIHTOL_INNER_MAX_TOLFAC(C));
#endif
  fprintf(fptr, "\nSlow step controller:\n");
  SUNCheckCall(SUNAdaptController_Write(MRIHTOL_CSLOW(C), fptr));
  fprintf(fptr, "\nFast tolerance controller:\n");
  SUNCheckCall(SUNAdaptController_Write(MRIHTOL_CFAST(C), fptr));
  return SUN_SUCCESS;
}